

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O3

void getata(int m,int n,int_t nz,int_t *colptr,int_t *rowind,int_t *atanz,int_t **ata_colptr,
           int_t **ata_rowind)

{
  int *piVar1;
  int_t *piVar2;
  int iVar3;
  void *__s;
  undefined4 *addr;
  void *addr_00;
  ulong uVar4;
  ulong uVar5;
  int_t *piVar6;
  long lVar7;
  int_t iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  char msg [256];
  char local_138 [264];
  
  iVar3 = n;
  if (n < m) {
    iVar3 = m;
  }
  __s = superlu_malloc((long)iVar3 * 4 + 4);
  if (__s == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xa2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  addr = (undefined4 *)superlu_malloc((long)m * 4 + 4);
  if (addr == (undefined4 *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xa4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  addr_00 = superlu_malloc((long)nz << 2);
  if (addr_00 == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xa6,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  if (0 < m) {
    memset(__s,0,(ulong)(uint)m * 4);
  }
  uVar10 = (ulong)(uint)n;
  if (0 < n) {
    iVar3 = *colptr;
    uVar4 = 0;
    do {
      lVar7 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      iVar12 = colptr[lVar7];
      if (iVar3 < colptr[lVar7]) {
        lVar7 = (long)iVar3;
        do {
          piVar1 = (int *)((long)__s + (long)rowind[lVar7] * 4);
          *piVar1 = *piVar1 + 1;
          lVar7 = lVar7 + 1;
          iVar12 = colptr[uVar4];
        } while (lVar7 < colptr[uVar4]);
      }
      iVar3 = iVar12;
    } while (uVar4 != uVar10);
  }
  *addr = 0;
  if (0 < m) {
    uVar4 = 0;
    do {
      addr[uVar4 + 1] = *(int *)((long)__s + uVar4 * 4) + addr[uVar4];
      *(undefined4 *)((long)__s + uVar4 * 4) = addr[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)m != uVar4);
  }
  if (n < 1) {
    iVar3 = 0;
  }
  else {
    iVar8 = *colptr;
    uVar4 = 0;
    do {
      uVar5 = uVar4 + 1;
      iVar3 = colptr[uVar4 + 1];
      if (iVar8 < colptr[uVar4 + 1]) {
        lVar7 = (long)iVar8;
        do {
          iVar3 = rowind[lVar7];
          *(int *)((long)addr_00 + (long)*(int *)((long)__s + (long)iVar3 * 4) * 4) = (int)uVar4;
          piVar1 = (int *)((long)__s + (long)iVar3 * 4);
          *piVar1 = *piVar1 + 1;
          lVar7 = lVar7 + 1;
          iVar3 = colptr[uVar5];
        } while (lVar7 < colptr[uVar5]);
      }
      iVar8 = iVar3;
      uVar4 = uVar5;
    } while (uVar5 != uVar10);
    if (n < 1) {
      iVar3 = 0;
    }
    else {
      memset(__s,0xff,uVar10 * 4);
      iVar3 = 0;
      uVar4 = 0;
      do {
        *(int *)((long)__s + uVar4 * 4) = (int)uVar4;
        lVar7 = (long)colptr[uVar4];
        uVar5 = uVar4 + 1;
        iVar12 = colptr[uVar4 + 1];
        if (colptr[uVar4] < iVar12) {
          do {
            lVar9 = (long)rowind[lVar7];
            lVar11 = (long)(int)addr[lVar9];
            iVar14 = addr[lVar9 + 1];
            if ((int)addr[lVar9] < iVar14) {
              do {
                lVar13 = (long)*(int *)((long)addr_00 + lVar11 * 4);
                if (uVar4 != *(uint *)((long)__s + lVar13 * 4)) {
                  *(int *)((long)__s + lVar13 * 4) = (int)uVar4;
                  iVar3 = iVar3 + 1;
                  iVar14 = addr[lVar9 + 1];
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < iVar14);
              iVar12 = colptr[uVar5];
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < iVar12);
        }
        uVar4 = uVar5;
      } while (uVar5 != uVar10);
    }
  }
  *atanz = iVar3;
  piVar6 = (int_t *)superlu_malloc((long)n * 4 + 4);
  *ata_colptr = piVar6;
  if (piVar6 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ata_colptr[]",0xe4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  if ((long)*atanz != 0) {
    piVar6 = (int_t *)superlu_malloc((long)*atanz << 2);
    *ata_rowind = piVar6;
    if (piVar6 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ata_rowind[]",0xe7,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(local_138);
    }
  }
  piVar6 = *ata_colptr;
  if (n < 1) {
    iVar3 = 0;
  }
  else {
    piVar2 = *ata_rowind;
    memset(__s,0xff,uVar10 * 4);
    iVar3 = 0;
    uVar4 = 0;
    do {
      piVar6[uVar4] = iVar3;
      *(int *)((long)__s + uVar4 * 4) = (int)uVar4;
      lVar7 = (long)colptr[uVar4];
      uVar5 = uVar4 + 1;
      iVar12 = colptr[uVar4 + 1];
      if (colptr[uVar4] < iVar12) {
        do {
          lVar9 = (long)rowind[lVar7];
          lVar11 = (long)(int)addr[lVar9];
          iVar14 = addr[lVar9 + 1];
          if ((int)addr[lVar9] < iVar14) {
            do {
              iVar12 = *(int *)((long)addr_00 + lVar11 * 4);
              if (uVar4 != *(uint *)((long)__s + (long)iVar12 * 4)) {
                *(int *)((long)__s + (long)iVar12 * 4) = (int)uVar4;
                lVar13 = (long)iVar3;
                iVar3 = iVar3 + 1;
                piVar2[lVar13] = iVar12;
                iVar14 = addr[lVar9 + 1];
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < iVar14);
            iVar12 = colptr[uVar5];
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar12);
      }
      uVar4 = uVar5;
    } while (uVar5 != uVar10);
  }
  piVar6[n] = iVar3;
  superlu_free(__s);
  superlu_free(addr);
  superlu_free(addr_00);
  return;
}

Assistant:

void getata(const int m, const int n, const int_t nz, const int_t *colptr, const int_t *rowind,
            int_t *atanz, int_t **ata_colptr, int_t **ata_rowind)
{
    register int_t i, j, k, col, num_nz, ti, trow;
    int_t *marker, *b_colptr, *b_rowind;
    int_t *t_colptr, *t_rowind; /* a column oriented form of T = A' */

    if ( !(marker = (int_t*) SUPERLU_MALLOC((SUPERLU_MAX(m,n)+1)*sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC fails for marker[]");
    if ( !(t_colptr = (int_t*) SUPERLU_MALLOC((m+1) * sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC t_colptr[]");
    if ( !(t_rowind = (int_t*) SUPERLU_MALLOC(nz * sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC fails for t_rowind[]");

    
    /* Get counts of each column of T, and set up column pointers */
    for (i = 0; i < m; ++i) marker[i] = 0;
    for (j = 0; j < n; ++j) {
	for (i = colptr[j]; i < colptr[j+1]; ++i)
	    ++marker[rowind[i]];
    }
    t_colptr[0] = 0;
    for (i = 0; i < m; ++i) {
	t_colptr[i+1] = t_colptr[i] + marker[i];
	marker[i] = t_colptr[i];
    }

    /* Transpose the matrix from A to T */
    for (j = 0; j < n; ++j)
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    col = rowind[i];
	    t_rowind[marker[col]] = j;
	    ++marker[col];
	}

    
    /* ----------------------------------------------------------------
       compute B = T * A, where column j of B is:

       Struct (B_*j) =    UNION   ( Struct (T_*k) )
                        A_kj != 0

       do not include the diagonal entry
   
       ( Partition A as: A = (A_*1, ..., A_*n)
         Then B = T * A = (T * A_*1, ..., T * A_*n), where
         T * A_*j = (T_*1, ..., T_*m) * A_*j.  )
       ---------------------------------------------------------------- */

    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;

    /* First pass determines number of nonzeros in B */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    /* A_kj is nonzero, add pattern of column T_*k to B_*j */
	    k = rowind[i];
	    for (ti = t_colptr[k]; ti < t_colptr[k+1]; ++ti) {
		trow = t_rowind[ti];
		if ( marker[trow] != j ) {
		    marker[trow] = j;
		    num_nz++;
		}
	    }
	}
    }
    *atanz = num_nz;
    
    /* Allocate storage for A'*A */
    if ( !(*ata_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for ata_colptr[]");
    if ( *atanz ) {
	if ( !(*ata_rowind = (int_t*) SUPERLU_MALLOC( *atanz * sizeof(int_t)) ) )
	    ABORT("SUPERLU_MALLOC fails for ata_rowind[]");
    }
    b_colptr = *ata_colptr; /* aliasing */
    b_rowind = *ata_rowind;
    
    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;
    
    /* Compute each column of B, one at a time */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	b_colptr[j] = num_nz;
	
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    /* A_kj is nonzero, add pattern of column T_*k to B_*j */
	    k = rowind[i];
	    for (ti = t_colptr[k]; ti < t_colptr[k+1]; ++ti) {
		trow = t_rowind[ti];
		if ( marker[trow] != j ) {
		    marker[trow] = j;
		    b_rowind[num_nz++] = trow;
		}
	    }
	}
    }
    b_colptr[n] = num_nz;
       
    SUPERLU_FREE(marker);
    SUPERLU_FREE(t_colptr);
    SUPERLU_FREE(t_rowind);
}